

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::ClosureTest_TestClosureMethod1_Test>::
CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::ClosureTest_TestClosureMethod1_Test>
           *this)

{
  Test *this_00;
  TestFactoryImpl<google::protobuf::(anonymous_namespace)::ClosureTest_TestClosureMethod1_Test>
  *this_local;
  
  this_00 = (Test *)operator_new(0x48);
  google::protobuf::anon_unknown_0::ClosureTest_TestClosureMethod1_Test::
  ClosureTest_TestClosureMethod1_Test((ClosureTest_TestClosureMethod1_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }